

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool sysbvm_parser_isBinaryExpressionOperator(int tokenKind)

{
  _Bool local_9;
  int tokenKind_local;
  
  if (((tokenKind == 6) || (tokenKind - 0xfU < 3)) || (tokenKind == 0x14)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool sysbvm_parser_isBinaryExpressionOperator(int tokenKind)
{
    switch(tokenKind)
    {
    case SYSBVM_TOKEN_KIND_OPERATOR:
    case SYSBVM_TOKEN_KIND_STAR:
    case SYSBVM_TOKEN_KIND_LESS_THAN:
    case SYSBVM_TOKEN_KIND_GREATER_THAN:
    case SYSBVM_TOKEN_KIND_BAR:
        return true;
    default:
        return false;
    }
}